

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BPlusTree.h
# Opt level: O3

Iterator __thiscall
BPlusTree<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MultiMap::MultiMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
::search(BPlusTree<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MultiMap::MultiMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
         *this,Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MultiMap::MultiMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
               *entry)

{
  bool bVar1;
  int iVar2;
  Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MultiMap::MultiMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
  *left;
  BPlusTree<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MultiMap::MultiMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
  **ppBVar3;
  size_t index;
  Iterator IVar4;
  
  iVar2 = b_array::
          first_ge<Map::Pair<std::__cxx11::string,MultiMap::MultiMap<std::__cxx11::string,long>>>
                    (&this->data,this->data_size,entry);
  index = (size_t)iVar2;
  IVar4.offset = index;
  IVar4.node_ptr = this;
  if (index < this->data_size) {
    left = b_array::
           Array<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MultiMap::MultiMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
           ::operator[](&this->data,index);
    bVar1 = Map::operator==(left,entry);
    if (bVar1) {
      if (this->subset_size == 0) {
        return IVar4;
      }
      index = index + 1;
      goto LAB_00106a29;
    }
  }
  if (this->subset_size == 0) {
    return (Iterator)ZEXT816(0);
  }
LAB_00106a29:
  ppBVar3 = b_array::
            Array<BPlusTree<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MultiMap::MultiMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>_*>
            ::operator[](&this->subset,index);
  IVar4 = search(*ppBVar3,entry);
  return IVar4;
}

Assistant:

typename BPlusTree<T>::Iterator BPlusTree<T>::search(const T& entry) const {
    size_t index = b_array::first_ge(data, data_size, entry);
    bool found = index < data_size && data[index] == entry;
    if (found && is_leaf())
        return Iterator((BPlusTree<T>*)this, index);
    else if (found && !is_leaf())
        return subset[index + 1]->search(entry);
    else if (!found && !is_leaf())
        return subset[index]->search(entry);
    else if (!found && is_leaf())
        return Iterator(nullptr);    
    return Iterator(nullptr);
}